

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringView.cpp
# Opt level: O2

bool Corrade::Containers::operator>(StringView a,StringView b)

{
  int iVar1;
  ulong __n;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar4 = a._sizePlusFlags & 0x3fffffffffffffff;
  uVar3 = b._sizePlusFlags & 0x3fffffffffffffff;
  __n = uVar4;
  if (uVar3 < uVar4) {
    __n = uVar3;
  }
  iVar1 = memcmp(a._data,b._data,__n);
  bVar2 = 0 < iVar1;
  if (iVar1 == 0) {
    bVar2 = uVar3 < uVar4;
  }
  return bVar2;
}

Assistant:

bool operator>(const StringView a, const StringView b) {
    /* Not using the size() accessor to speed up debug builds */
    const std::size_t aSize = a._sizePlusFlags & ~Implementation::StringViewSizeMask;
    const std::size_t bSize = b._sizePlusFlags & ~Implementation::StringViewSizeMask;
    const int result = std::memcmp(a._data, b._data, Utility::min(aSize, bSize));
    if(result != 0) return result > 0;
    if(aSize > bSize) return true;
    return false;
}